

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

uint32 google::protobuf::strtou32_adaptor(char *nptr,char **endptr,int base)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  uint32 uVar5;
  
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  *piVar3 = 0;
  uVar4 = strtoul(nptr,endptr,base);
  iVar2 = *piVar3;
  uVar5 = 0xffffffff;
  if (iVar2 != 0x22 || uVar4 != 0xffffffffffffffff) {
    if (uVar4 >> 0x20 == 0 || iVar2 != 0) {
      if (iVar2 == 0) {
        *piVar3 = iVar1;
      }
      uVar5 = (uint32)uVar4;
    }
    else {
      *piVar3 = 0x22;
    }
  }
  return uVar5;
}

Assistant:

uint32 strtou32_adaptor(const char *nptr, char **endptr, int base) {
  const int saved_errno = errno;
  errno = 0;
  const unsigned long result = strtoul(nptr, endptr, base);
  if (errno == ERANGE && result == ULONG_MAX) {
    return kuint32max;
  } else if (errno == 0 && result > kuint32max) {
    errno = ERANGE;
    return kuint32max;
  }
  if (errno == 0)
    errno = saved_errno;
  return static_cast<uint32>(result);
}